

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_device_buffer.cpp
# Opt level: O0

shared_device_buffer * __thiscall
gpu::shared_device_buffer::operator=(shared_device_buffer *this,shared_device_buffer *other)

{
  shared_device_buffer *other_local;
  shared_device_buffer *this_local;
  
  if (this != other) {
    decref(this);
    this->buffer_ = other->buffer_;
    this->data_ = other->data_;
    this->type_ = other->type_;
    this->size_ = other->size_;
    this->offset_ = other->offset_;
    incref(this);
  }
  return this;
}

Assistant:

shared_device_buffer &shared_device_buffer::operator= (const shared_device_buffer &other)
{
	if (this != &other) {
		decref();
		buffer_	= other.buffer_;
		data_	= other.data_;
		type_	= other.type_;
		size_	= other.size_;
		offset_	= other.offset_;
		incref();
	}

	return *this;
}